

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

FT_Error ft_gzip_check_header(FT_Stream stream)

{
  FT_Byte FVar1;
  FT_UInt16 FVar2;
  FT_Error FVar3;
  char cVar4;
  int iVar5;
  FT_Byte head [4];
  FT_Error local_1c;
  
  local_1c = FT_Stream_Seek(stream,0);
  if ((((local_1c == 0) && (local_1c = FT_Stream_Read(stream,head,4), local_1c == 0)) &&
      (local_1c = 3, head[0] == '\x1f')) &&
     (((head[1] == 0x8b && (head[2] == '\b')) && (head[3] < 0x20)))) {
    local_1c = FT_Stream_Skip(stream,6);
    if ((head[3] & 4) != 0) {
      FVar2 = FT_Stream_ReadUShortLE(stream,&local_1c);
      if (local_1c != 0) {
        return local_1c;
      }
      FVar3 = FT_Stream_Skip(stream,(ulong)FVar2);
      if (FVar3 != 0) {
        return FVar3;
      }
      local_1c = 0;
    }
    if ((head[3] & 8) != 0) {
      do {
        FVar1 = FT_Stream_ReadByte(stream,&local_1c);
        iVar5 = (uint)(FVar1 == '\0') * 3;
        if (local_1c != 0) {
          iVar5 = 2;
        }
      } while (iVar5 == 0);
      if (iVar5 - 1U < 2) {
        return local_1c;
      }
    }
    if ((head[3] & 0x10) != 0) {
      do {
        FVar1 = FT_Stream_ReadByte(stream,&local_1c);
        cVar4 = (FVar1 == '\0') * '\x05';
        if (local_1c != 0) {
          cVar4 = '\x02';
        }
      } while (cVar4 == '\0');
      if (cVar4 != '\x05') {
        return local_1c;
      }
    }
    if ((head[3] & 2) != 0) {
      local_1c = FT_Stream_Skip(stream,2);
    }
  }
  return local_1c;
}

Assistant:

static FT_Error
  ft_gzip_check_header( FT_Stream  stream )
  {
    FT_Error  error;
    FT_Byte   head[4];


    if ( FT_STREAM_SEEK( 0 )       ||
         FT_STREAM_READ( head, 4 ) )
      goto Exit;

    /* head[0] && head[1] are the magic numbers;    */
    /* head[2] is the method, and head[3] the flags */
    if ( head[0] != 0x1F              ||
         head[1] != 0x8B              ||
         head[2] != Z_DEFLATED        ||
        (head[3] & FT_GZIP_RESERVED)  )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* skip time, xflags and os code */
    (void)FT_STREAM_SKIP( 6 );

    /* skip the extra field */
    if ( head[3] & FT_GZIP_EXTRA_FIELD )
    {
      FT_UInt  len;


      if ( FT_READ_USHORT_LE( len ) ||
           FT_STREAM_SKIP( len )    )
        goto Exit;
    }

    /* skip original file name */
    if ( head[3] & FT_GZIP_ORIG_NAME )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip .gz comment */
    if ( head[3] & FT_GZIP_COMMENT )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip CRC */
    if ( head[3] & FT_GZIP_HEAD_CRC )
      if ( FT_STREAM_SKIP( 2 ) )
        goto Exit;

  Exit:
    return error;
  }